

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::codepointList(GrpParser *this)

{
  ASTFactory *this_00;
  ASTFactory *this_01;
  bool bVar1;
  int iVar2;
  RefAST RVar3;
  NoViableAltException *pNVar4;
  RefAST *pRVar5;
  RefAST tmp137_AST;
  RefAST codepointList_AST;
  ASTPair currentAST;
  RefAST tmp135_AST;
  undefined1 local_b0 [16];
  RefCount<AST> local_a0;
  ASTPair local_98;
  RefAST *local_80;
  RefCount<Token> local_78;
  RefCount<Token> local_70;
  RefCount<AST> local_68;
  RefToken local_60;
  RefAST local_58;
  RefAST local_50;
  RefToken local_48;
  RefCount<Token> local_40;
  RefAST local_38;
  
  local_80 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(local_80,&nullAST);
  local_a0.ref = nullAST.ref;
  local_98.root.ref = (Ref *)0x0;
  local_98.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_a0.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar3 = nullAST;
  if (iVar2 < 0x14) {
    if (iVar2 == 6) {
      if (nullAST.ref == (Ref *)0x0) {
        RVar3.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_68.ref = RVar3.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
      this_00 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create((ASTFactory *)local_b0,(RefToken *)this_00);
      RefCount<AST>::operator=(&local_68,(RefCount<AST> *)local_b0);
      RefCount<AST>::~RefCount((RefCount<AST> *)local_b0);
      RefCount<Token>::~RefCount(&local_70);
      Parser::match((Parser *)this,6);
      codepointItem(this);
      local_38.ref = local_80->ref;
      if (local_38.ref == (Ref *)0x0) {
        local_38.ref = (Ref *)0x0;
      }
      else {
        (local_38.ref)->count = (local_38.ref)->count + 1;
      }
      ASTFactory::addASTChild(this_00,&local_98,&local_38);
      pRVar5 = &local_38;
      while( true ) {
        RefCount<AST>::~RefCount(pRVar5);
        iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
        bVar1 = BitSet::member(&_tokenSet_36,iVar2);
        RVar3 = nullAST;
        if (!bVar1) break;
        iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
        RVar3 = nullAST;
        if (iVar2 < 0x15) {
          if ((iVar2 != 0x11) && (iVar2 != 0x14)) {
LAB_0019dfb8:
            pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
            (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
            NoViableAltException::NoViableAltException(pNVar4,&local_48);
            __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                        NoViableAltException::~NoViableAltException);
          }
        }
        else if (iVar2 == 0x15) {
          if (nullAST.ref == (Ref *)0x0) {
            RVar3.ref = (Ref *)0x0;
          }
          else {
            (nullAST.ref)->count = (nullAST.ref)->count + 1;
          }
          local_b0._0_8_ = RVar3.ref;
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
          this_01 = (ASTFactory *)(local_b0 + 8);
          ASTFactory::create(this_01,(RefToken *)this_00);
          RefCount<AST>::operator=((RefCount<AST> *)local_b0,(RefCount<AST> *)this_01);
          RefCount<AST>::~RefCount((RefCount<AST> *)this_01);
          RefCount<Token>::~RefCount(&local_40);
          Parser::match((Parser *)this,0x15);
          RefCount<AST>::~RefCount((RefCount<AST> *)local_b0);
        }
        else if (iVar2 != 0x21) goto LAB_0019dfb8;
        codepointItem(this);
        local_50.ref = local_80->ref;
        if (local_50.ref == (Ref *)0x0) {
          local_50.ref = (Ref *)0x0;
        }
        else {
          (local_50.ref)->count = (local_50.ref)->count + 1;
        }
        ASTFactory::addASTChild(this_00,&local_98,&local_50);
        pRVar5 = &local_50;
      }
      if (nullAST.ref == (Ref *)0x0) {
        RVar3.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_b0._0_8_ = RVar3.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
      ASTFactory::create((ASTFactory *)(local_b0 + 8),(RefToken *)this_00);
      RefCount<AST>::operator=((RefCount<AST> *)local_b0,(RefCount<AST> *)(local_b0 + 8));
      RefCount<AST>::~RefCount((RefCount<AST> *)(local_b0 + 8));
      RefCount<Token>::~RefCount(&local_78);
      Parser::match((Parser *)this,7);
      RefCount<AST>::~RefCount((RefCount<AST> *)local_b0);
      pRVar5 = &local_68;
      goto LAB_0019df65;
    }
    if (iVar2 != 0x11) goto LAB_0019e002;
  }
  else if ((iVar2 != 0x14) && (iVar2 != 0x21)) {
LAB_0019e002:
    pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
    NoViableAltException::NoViableAltException(pNVar4,&local_60);
    __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  codepointItem(this);
  local_58.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
  if (local_58.ref == (Ref *)0x0) {
    local_58.ref = (Ref *)0x0;
  }
  else {
    (local_58.ref)->count = (local_58.ref)->count + 1;
  }
  ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_98,&local_58);
  pRVar5 = &local_58;
LAB_0019df65:
  RefCount<AST>::~RefCount(pRVar5);
  RefCount<AST>::operator=(&local_a0,&local_98.root);
  RefCount<AST>::operator=(local_80,&local_a0);
  RefCount<AST>::~RefCount(&local_a0);
  RefCount<AST>::~RefCount(&local_98.child);
  RefCount<AST>::~RefCount(&local_98.root);
  return;
}

Assistant:

void GrpParser::codepointList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST codepointList_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case OP_LPAREN:
		{
			{
			RefAST tmp135_AST = nullAST;
			tmp135_AST = astFactory.create(LT(1));
			match(OP_LPAREN);
			codepointItem();
			astFactory.addASTChild(currentAST, returnAST);
			{
			do {
				if ((_tokenSet_36.member(LA(1)))) {
					{
					switch ( LA(1)) {
					case OP_COMMA:
					{
						RefAST tmp136_AST = nullAST;
						tmp136_AST = astFactory.create(LT(1));
						match(OP_COMMA);
						break;
					}
					case LIT_INT:
					case LIT_STRING:
					case LIT_CHAR:
					{
						break;
					}
					default:
					{
						throw NoViableAltException(LT(1));
					}
					}
					}
					codepointItem();
					astFactory.addASTChild(currentAST, returnAST);
				}
				else {
					goto _loop101;
				}
				
			} while (true);
			_loop101:;
			}
			RefAST tmp137_AST = nullAST;
			tmp137_AST = astFactory.create(LT(1));
			match(OP_RPAREN);
			}
			break;
		}
		case LIT_INT:
		case LIT_STRING:
		case LIT_CHAR:
		{
			codepointItem();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		codepointList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_37);
	}
	returnAST = codepointList_AST;
}